

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,ImWchar c)

{
  float fVar1;
  float fVar2;
  ushort uVar3;
  ulong uVar4;
  uint col_00;
  undefined6 in_register_00000082;
  ImFontGlyph *pIVar5;
  float fVar6;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  
  uVar4 = CONCAT62(in_register_00000082,c) & 0xffffffff;
  if ((uVar4 < (ulong)(long)(this->IndexLookup).Size) &&
     (uVar3 = (this->IndexLookup).Data[uVar4], uVar3 != 0xffff)) {
    pIVar5 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar3 * 0x28);
  }
  else {
    pIVar5 = this->FallbackGlyph;
  }
  if ((pIVar5 != (ImFontGlyph *)0x0) &&
     (((undefined1  [40])*pIVar5 & (undefined1  [40])0x2) != (undefined1  [40])0x0)) {
    col_00 = col | 0xffffff;
    if (((undefined1  [40])*pIVar5 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      col_00 = col;
    }
    fVar6 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                   ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
    fVar1 = pos->x;
    fVar2 = pos->y;
    ImDrawList::PrimReserve(draw_list,6,4);
    local_20.x = pIVar5->X0 * fVar6 + (float)(int)fVar1;
    local_20.y = pIVar5->Y0 * fVar6 + (float)(int)fVar2;
    local_28.x = pIVar5->X1 * fVar6 + (float)(int)fVar1;
    local_28.y = fVar6 * pIVar5->Y1 + (float)(int)fVar2;
    local_30.x = pIVar5->U0;
    local_30.y = pIVar5->V0;
    local_38.x = pIVar5->U1;
    local_38.y = pIVar5->V1;
    ImDrawList::PrimRectUV(draw_list,&local_20,&local_28,&local_30,&local_38,col_00);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(x + glyph->X0 * scale, y + glyph->Y0 * scale), ImVec2(x + glyph->X1 * scale, y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}